

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

bool __thiscall
VmaDefragmentationContext_T::AllocInOtherBlock
          (VmaDefragmentationContext_T *this,size_t start,size_t end,MoveAllocationData *data,
          VmaBlockVector *vector)

{
  VmaDeviceMemoryBlock *pBlock;
  bool bVar1;
  int iVar2;
  VkResult VVar3;
  undefined4 extraout_var;
  
  do {
    if (end <= start) {
      return false;
    }
    pBlock = (vector->m_Blocks).m_pArray[start];
    iVar2 = (*pBlock->m_pMetadata->_vptr_VmaBlockMetadata[6])();
    if (data->size <= CONCAT44(extraout_var,iVar2)) {
      VVar3 = VmaBlockVector::AllocateFromBlock
                        (vector,pBlock,data->size,data->alignment,data->flags,this,data->type,0,
                         &(data->move).dstTmpAllocation);
      if (VVar3 == VK_SUCCESS) {
        VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::push_back
                  (&this->m_Moves,&data->move);
        bVar1 = IncrementCounters(this,data->size);
        return bVar1;
      }
    }
    start = start + 1;
  } while( true );
}

Assistant:

bool VmaDefragmentationContext_T::AllocInOtherBlock(size_t start, size_t end, MoveAllocationData& data, VmaBlockVector& vector)
{
    for (; start < end; ++start)
    {
        VmaDeviceMemoryBlock* dstBlock = vector.GetBlock(start);
        if (dstBlock->m_pMetadata->GetSumFreeSize() >= data.size)
        {
            if (vector.AllocateFromBlock(dstBlock,
                data.size,
                data.alignment,
                data.flags,
                this,
                data.type,
                0,
                &data.move.dstTmpAllocation) == VK_SUCCESS)
            {
                m_Moves.push_back(data.move);
                if (IncrementCounters(data.size))
                    return true;
                break;
            }
        }
    }
    return false;
}